

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void OpticsParser::parseIntegratedResults(ProductData *product,json *product_json)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *pdVar4;
  optional<double> oVar5;
  CIEValue local_448;
  allocator<char> local_429;
  string local_428;
  _Storage<double,_true> local_408;
  optional<double> rfcie_z;
  string local_3f0;
  _Storage<double,_true> local_3d0;
  optional<double> rfcie_y;
  string local_3b8;
  _Storage<double,_true> local_398;
  optional<double> rfcie_x;
  allocator<char> local_369;
  string local_368;
  _Storage<double,_true> local_348;
  optional<double> tcie_z;
  string local_330;
  _Storage<double,_true> local_310;
  optional<double> tcie_y;
  string local_2f8;
  _Storage<double,_true> local_2d8;
  optional<double> tcie_x;
  string local_2c0;
  _Storage<double,_true> local_2a0;
  undefined1 uStack_298;
  undefined7 uStack_297;
  allocator<char> local_289;
  string local_288;
  _Storage<double,_true> local_268;
  undefined1 uStack_260;
  undefined7 uStack_25f;
  allocator<char> local_251;
  string local_250;
  _Storage<double,_true> local_230;
  undefined1 uStack_228;
  undefined7 uStack_227;
  allocator<char> local_219;
  string local_218;
  _Storage<double,_true> local_1f8;
  undefined1 uStack_1f0;
  undefined7 uStack_1ef;
  allocator<char> local_1e1;
  string local_1e0;
  _Storage<double,_true> local_1c0;
  undefined1 uStack_1b8;
  undefined7 uStack_1b7;
  allocator<char> local_1a9;
  string local_1a8;
  _Storage<double,_true> local_188;
  undefined1 uStack_180;
  undefined7 uStack_17f;
  allocator<char> local_171;
  string local_170;
  _Storage<double,_true> local_150;
  undefined1 uStack_148;
  undefined7 uStack_147;
  allocator<char> local_129;
  string local_128;
  _Storage<double,_true> local_108;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  _Storage<double,_true> _Stack_f8;
  PrecalculatedResults result;
  value_type integrated_results;
  json *product_json_local;
  ProductData *product_local;
  
  sVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::count<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary");
  if (sVar2 != 0) {
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::at<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary");
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::empty(pvVar3);
    if (!bVar1) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::at<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary")
      ;
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](pvVar3,0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&result.cieReflectanceFront.
                       super__Optional_base<OpticsParser::CIEValue,_true,_true>._M_payload.
                       super__Optional_payload_base<OpticsParser::CIEValue>._M_engaged,pvVar3);
      PrecalculatedResults::PrecalculatedResults((PrecalculatedResults *)&_Stack_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"tfsol",&local_129);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_128);
      uStack_100 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_108 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.solarTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_ff;
      result.solarTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_100;
      _Stack_f8 = local_108;
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"rfsol",&local_171);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_170);
      uStack_148 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_150 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.solarReflectanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_147;
      result.solarReflectanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_148;
      result.solarTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_150;
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"tfvis",&local_1a9);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_1a8);
      uStack_180 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_188 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.visibleTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_17f;
      result.visibleTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_180;
      result.solarReflectanceBack.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_188;
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"rfvis",&local_1e1);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_1e0);
      uStack_1b8 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_1c0 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.visibleReflectanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_1b7;
      result.visibleReflectanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_1b8;
      result.visibleTransmittanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_1c0;
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"rbvis",&local_219);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_218);
      uStack_1f0 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_1f8 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.visibleReflectanceBack.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_1ef;
      result.visibleReflectanceBack.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_1f0;
      result.visibleReflectanceFront.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_1f8;
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"tdw",&local_251);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_250);
      uStack_228 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_230 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.dwTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_227;
      result.dwTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_228;
      result.visibleReflectanceBack.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_230;
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"tuv",&local_289);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_288);
      uStack_260 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_268 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.uvTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_25f;
      result.uvTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_260;
      result.spfTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_268;
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"tspf",
                 (allocator<char> *)
                 &tcie_x.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_2c0);
      uStack_298 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged;
      local_2a0 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      result.spfTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._1_7_ = uStack_297;
      result.spfTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ = uStack_298;
      result.dwTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._8_8_ = local_2a0;
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &tcie_x.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"tciex",
                 (allocator<char> *)
                 &tcie_y.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_2f8);
      tcie_x.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_2d8 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &tcie_y.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"tciey",
                 (allocator<char> *)
                 &tcie_z.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_330);
      tcie_y.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_310 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &tcie_z.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"tciez",&local_369);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_368);
      tcie_z.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_348 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      bVar1 = std::optional<double>::has_value((optional<double> *)&local_2d8);
      if (((bVar1) &&
          (bVar1 = std::optional<double>::has_value((optional<double> *)&local_310), bVar1)) &&
         (bVar1 = std::optional<double>::has_value((optional<double> *)&local_348), bVar1)) {
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_2d8);
        rfcie_x.super__Optional_base<double,_true,_true>._M_payload.
        super__Optional_payload_base<double>._8_8_ = *pdVar4;
        std::optional<double>::operator*((optional<double> *)&local_310);
        std::optional<double>::operator*((optional<double> *)&local_348);
        std::optional<OpticsParser::CIEValue>::operator=
                  ((optional<OpticsParser::CIEValue> *)
                   &result.uvTransmittance.super__Optional_base<double,_true,_true>._M_payload.
                    super__Optional_payload_base<double>._M_engaged,
                   (CIEValue *)
                   &rfcie_x.super__Optional_base<double,_true,_true>._M_payload.
                    super__Optional_payload_base<double>._M_engaged);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"rfciex",
                 (allocator<char> *)
                 &rfcie_y.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_3b8);
      rfcie_x.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_398 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &rfcie_y.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"rfciey",
                 (allocator<char> *)
                 &rfcie_z.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_3f0);
      rfcie_y.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_3d0 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &rfcie_z.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"rfciez",&local_429);
      oVar5 = get_optional_field<double>
                        ((json *)&result.cieReflectanceFront.
                                  super__Optional_base<OpticsParser::CIEValue,_true,_true>.
                                  _M_payload.super__Optional_payload_base<OpticsParser::CIEValue>.
                                  _M_engaged,&local_428);
      rfcie_z.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_payload._0_1_ =
           oVar5.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
      local_408 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      bVar1 = std::optional<double>::has_value((optional<double> *)&local_398);
      if (((bVar1) &&
          (bVar1 = std::optional<double>::has_value((optional<double> *)&local_3d0), bVar1)) &&
         (bVar1 = std::optional<double>::has_value((optional<double> *)&local_408), bVar1)) {
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_398);
        local_448.x = *pdVar4;
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_3d0);
        local_448.y = *pdVar4;
        pdVar4 = std::optional<double>::operator*((optional<double> *)&local_408);
        local_448.z = *pdVar4;
        std::optional<OpticsParser::CIEValue>::operator=
                  ((optional<OpticsParser::CIEValue> *)
                   &result.cieTransmittance.super__Optional_base<OpticsParser::CIEValue,_true,_true>
                    ._M_payload.super__Optional_payload_base<OpticsParser::CIEValue>._M_engaged,
                   &local_448);
      }
      std::optional<OpticsParser::PrecalculatedResults>::operator=
                (&product->precalculatedResults,(PrecalculatedResults *)&_Stack_f8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&result.cieReflectanceFront.
                        super__Optional_base<OpticsParser::CIEValue,_true,_true>._M_payload.
                        super__Optional_payload_base<OpticsParser::CIEValue>._M_engaged);
    }
  }
  return;
}

Assistant:

void parseIntegratedResults(ProductData & product, nlohmann::json const & product_json)
    {
        if(product_json.count("integrated_results_summary") == 0
           || product_json.at("integrated_results_summary").empty())
        {
            return;
        }
        auto integrated_results = product_json.at("integrated_results_summary")[0];
        PrecalculatedResults result;

        result.solarTransmittanceFront = get_optional_field<double>(integrated_results, "tfsol");
        result.solarReflectanceFront = get_optional_field<double>(integrated_results, "rfsol");
        result.visibleTransmittanceFront = get_optional_field<double>(integrated_results, "tfvis");
        result.visibleReflectanceFront = get_optional_field<double>(integrated_results, "rfvis");
        result.visibleReflectanceBack = get_optional_field<double>(integrated_results, "rbvis");
        result.dwTransmittance = get_optional_field<double>(integrated_results, "tdw");
        result.uvTransmittance = get_optional_field<double>(integrated_results, "tuv");
        result.spfTransmittance = get_optional_field<double>(integrated_results, "tspf");
        auto tcie_x = get_optional_field<double>(integrated_results, "tciex");
        auto tcie_y = get_optional_field<double>(integrated_results, "tciey");
        auto tcie_z = get_optional_field<double>(integrated_results, "tciez");
        if(tcie_x.has_value() && tcie_y.has_value() && tcie_z.has_value())
        {
            result.cieTransmittance = CIEValue{*tcie_x, *tcie_y, *tcie_z};
        }
        auto rfcie_x = get_optional_field<double>(integrated_results, "rfciex");
        auto rfcie_y = get_optional_field<double>(integrated_results, "rfciey");
        auto rfcie_z = get_optional_field<double>(integrated_results, "rfciez");
        if(rfcie_x.has_value() && rfcie_y.has_value() && rfcie_z.has_value())
        {
            result.cieReflectanceFront = CIEValue{*rfcie_x, *rfcie_y, *rfcie_z};
        }
        product.precalculatedResults = result;
    }